

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlReconciliateNs(xmlDocPtr doc,xmlNodePtr tree)

{
  _xmlAttr *p_Var1;
  void *pvVar2;
  ulong uVar3;
  xmlNsPtr pxVar4;
  ulong uVar5;
  _xmlNode *p_Var6;
  _xmlNode *p_Var7;
  int iVar8;
  xmlNodePtr pxVar9;
  int iVar10;
  ulong uVar11;
  void *local_58;
  
  iVar8 = -1;
  if ((((tree != (xmlNodePtr)0x0) && (doc != (xmlDocPtr)0x0)) && (tree->type == XML_ELEMENT_NODE))
     && ((doc->type == XML_DOCUMENT_NODE && (tree->doc == doc)))) {
    uVar11 = 0;
    iVar8 = 0;
    pvVar2 = (void *)0x0;
    local_58 = (void *)0x0;
    p_Var7 = tree;
    do {
      if (p_Var7->ns != (xmlNs *)0x0) {
        if (iVar8 == 0) {
          local_58 = (*xmlMalloc)(0x50);
          if (local_58 == (void *)0x0) {
LAB_00187ab4:
            __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"fixing namespaces");
            return -1;
          }
          pvVar2 = (*xmlMalloc)(0x50);
          if (pvVar2 != (void *)0x0) {
            iVar8 = 10;
            goto LAB_001877e4;
          }
LAB_00187a8e:
          __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"fixing namespaces");
LAB_00187af6:
          (*xmlFree)(local_58);
          return -1;
        }
LAB_001877e4:
        iVar10 = (int)uVar11;
        if (iVar10 < 1) {
          uVar5 = 0;
        }
        else {
          uVar3 = 0;
          do {
            if (*(xmlNs **)((long)local_58 + uVar3 * 8) == p_Var7->ns) {
              p_Var7->ns = *(xmlNs **)((long)pvVar2 + uVar3 * 8);
              uVar5 = uVar3;
              break;
            }
            uVar3 = uVar3 + 1;
            uVar5 = uVar11;
          } while (uVar11 != uVar3);
        }
        if (((int)uVar5 == iVar10) &&
           (pxVar4 = xmlNewReconciledNs(doc,tree,p_Var7->ns), pxVar4 != (xmlNsPtr)0x0)) {
          if (iVar8 <= iVar10) {
            iVar8 = iVar8 * 2;
            local_58 = (*xmlRealloc)(local_58,(long)iVar8 << 3);
            if (local_58 == (void *)0x0) {
LAB_00187ad0:
              local_58 = pvVar2;
              __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"fixing namespaces");
              goto LAB_00187af6;
            }
            pvVar2 = (*xmlRealloc)(pvVar2,(long)iVar8 << 3);
            if (pvVar2 == (void *)0x0) goto LAB_00187a8e;
          }
          *(xmlNsPtr *)((long)pvVar2 + (long)iVar10 * 8) = pxVar4;
          uVar11 = (ulong)(iVar10 + 1);
          *(xmlNs **)((long)local_58 + (long)iVar10 * 8) = p_Var7->ns;
          p_Var7->ns = pxVar4;
        }
      }
      if (p_Var7->type == XML_ELEMENT_NODE) {
        for (p_Var1 = p_Var7->properties; p_Var1 != (_xmlAttr *)0x0; p_Var1 = p_Var1->next) {
          if (p_Var1->ns != (xmlNs *)0x0) {
            if (iVar8 == 0) {
              local_58 = (*xmlMalloc)(0x50);
              if (local_58 == (void *)0x0) goto LAB_00187ab4;
              pvVar2 = (*xmlMalloc)(0x50);
              if (pvVar2 == (void *)0x0) goto LAB_00187a8e;
              iVar8 = 10;
            }
            iVar10 = (int)uVar11;
            if (iVar10 < 1) {
              uVar5 = 0;
            }
            else {
              uVar3 = 0;
              do {
                if (*(xmlNs **)((long)local_58 + uVar3 * 8) == p_Var1->ns) {
                  p_Var1->ns = *(xmlNs **)((long)pvVar2 + uVar3 * 8);
                  uVar5 = uVar3;
                  break;
                }
                uVar3 = uVar3 + 1;
                uVar5 = uVar11;
              } while (uVar11 != uVar3);
            }
            if (((int)uVar5 == iVar10) &&
               (pxVar4 = xmlNewReconciledNs(doc,tree,p_Var1->ns), pxVar4 != (xmlNsPtr)0x0)) {
              if (iVar8 <= iVar10) {
                iVar8 = iVar8 * 2;
                local_58 = (*xmlRealloc)(local_58,(long)iVar8 << 3);
                if (local_58 == (void *)0x0) goto LAB_00187ad0;
                pvVar2 = (*xmlRealloc)(pvVar2,(long)iVar8 << 3);
                if (pvVar2 == (void *)0x0) goto LAB_00187a8e;
              }
              *(xmlNsPtr *)((long)pvVar2 + (long)iVar10 * 8) = pxVar4;
              uVar11 = (ulong)(iVar10 + 1);
              *(xmlNs **)((long)local_58 + (long)iVar10 * 8) = p_Var1->ns;
              p_Var1->ns = pxVar4;
            }
          }
        }
      }
      if ((p_Var7->children == (_xmlNode *)0x0) ||
         (p_Var6 = p_Var7->children, p_Var7->type == XML_ENTITY_REF_NODE)) {
        if (p_Var7 == tree) break;
        p_Var6 = p_Var7->next;
        if (p_Var7->next == (_xmlNode *)0x0) {
          do {
            if (p_Var7 == tree) goto LAB_00187a4d;
            pxVar9 = p_Var7;
            if (p_Var7->parent != (xmlNodePtr)0x0) {
              pxVar9 = p_Var7->parent;
            }
            if ((pxVar9 != tree) && (p_Var7 = pxVar9->next, p_Var7 != (_xmlNode *)0x0))
            goto LAB_00187a4d;
            p_Var7 = pxVar9;
          } while (pxVar9->parent != (_xmlNode *)0x0);
          p_Var7 = (_xmlNode *)0x0;
LAB_00187a4d:
          p_Var6 = (_xmlNode *)0x0;
          if (p_Var7 != tree) {
            p_Var6 = p_Var7;
          }
        }
      }
      p_Var7 = p_Var6;
    } while (p_Var6 != (_xmlNode *)0x0);
    if (local_58 != (void *)0x0) {
      (*xmlFree)(local_58);
    }
    iVar8 = 0;
    if (pvVar2 != (void *)0x0) {
      (*xmlFree)(pvVar2);
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

int
xmlReconciliateNs(xmlDocPtr doc, xmlNodePtr tree) {
    xmlNsPtr *oldNs = NULL;
    xmlNsPtr *newNs = NULL;
    int sizeCache = 0;
    int nbCache = 0;

    xmlNsPtr n;
    xmlNodePtr node = tree;
    xmlAttrPtr attr;
    int ret = 0, i;

    if ((node == NULL) || (node->type != XML_ELEMENT_NODE)) return(-1);
    if ((doc == NULL) || (doc->type != XML_DOCUMENT_NODE)) return(-1);
    if (node->doc != doc) return(-1);
    while (node != NULL) {
        /*
	 * Reconciliate the node namespace
	 */
	if (node->ns != NULL) {
	    /*
	     * initialize the cache if needed
	     */
	    if (sizeCache == 0) {
		sizeCache = 10;
		oldNs = (xmlNsPtr *) xmlMalloc(sizeCache *
					       sizeof(xmlNsPtr));
		if (oldNs == NULL) {
		    xmlTreeErrMemory("fixing namespaces");
		    return(-1);
		}
		newNs = (xmlNsPtr *) xmlMalloc(sizeCache *
					       sizeof(xmlNsPtr));
		if (newNs == NULL) {
		    xmlTreeErrMemory("fixing namespaces");
		    xmlFree(oldNs);
		    return(-1);
		}
	    }
	    for (i = 0;i < nbCache;i++) {
	        if (oldNs[i] == node->ns) {
		    node->ns = newNs[i];
		    break;
		}
	    }
	    if (i == nbCache) {
	        /*
		 * OK we need to recreate a new namespace definition
		 */
		n = xmlNewReconciledNs(doc, tree, node->ns);
		if (n != NULL) { /* :-( what if else ??? */
		    /*
		     * check if we need to grow the cache buffers.
		     */
		    if (sizeCache <= nbCache) {
		        sizeCache *= 2;
			oldNs = (xmlNsPtr *) xmlRealloc(oldNs, sizeCache *
			                               sizeof(xmlNsPtr));
		        if (oldNs == NULL) {
			    xmlTreeErrMemory("fixing namespaces");
			    xmlFree(newNs);
			    return(-1);
			}
			newNs = (xmlNsPtr *) xmlRealloc(newNs, sizeCache *
			                               sizeof(xmlNsPtr));
		        if (newNs == NULL) {
			    xmlTreeErrMemory("fixing namespaces");
			    xmlFree(oldNs);
			    return(-1);
			}
		    }
		    newNs[nbCache] = n;
		    oldNs[nbCache++] = node->ns;
		    node->ns = n;
                }
	    }
	}
	/*
	 * now check for namespace held by attributes on the node.
	 */
	if (node->type == XML_ELEMENT_NODE) {
	    attr = node->properties;
	    while (attr != NULL) {
		if (attr->ns != NULL) {
		    /*
		     * initialize the cache if needed
		     */
		    if (sizeCache == 0) {
			sizeCache = 10;
			oldNs = (xmlNsPtr *) xmlMalloc(sizeCache *
						       sizeof(xmlNsPtr));
			if (oldNs == NULL) {
			    xmlTreeErrMemory("fixing namespaces");
			    return(-1);
			}
			newNs = (xmlNsPtr *) xmlMalloc(sizeCache *
						       sizeof(xmlNsPtr));
			if (newNs == NULL) {
			    xmlTreeErrMemory("fixing namespaces");
			    xmlFree(oldNs);
			    return(-1);
			}
		    }
		    for (i = 0;i < nbCache;i++) {
			if (oldNs[i] == attr->ns) {
			    attr->ns = newNs[i];
			    break;
			}
		    }
		    if (i == nbCache) {
			/*
			 * OK we need to recreate a new namespace definition
			 */
			n = xmlNewReconciledNs(doc, tree, attr->ns);
			if (n != NULL) { /* :-( what if else ??? */
			    /*
			     * check if we need to grow the cache buffers.
			     */
			    if (sizeCache <= nbCache) {
				sizeCache *= 2;
				oldNs = (xmlNsPtr *) xmlRealloc(oldNs,
				           sizeCache * sizeof(xmlNsPtr));
				if (oldNs == NULL) {
				    xmlTreeErrMemory("fixing namespaces");
				    xmlFree(newNs);
				    return(-1);
				}
				newNs = (xmlNsPtr *) xmlRealloc(newNs,
				           sizeCache * sizeof(xmlNsPtr));
				if (newNs == NULL) {
				    xmlTreeErrMemory("fixing namespaces");
				    xmlFree(oldNs);
				    return(-1);
				}
			    }
			    newNs[nbCache] = n;
			    oldNs[nbCache++] = attr->ns;
			    attr->ns = n;
			}
		    }
		}
		attr = attr->next;
	    }
	}

	/*
	 * Browse the full subtree, deep first
	 */
        if ((node->children != NULL) && (node->type != XML_ENTITY_REF_NODE)) {
	    /* deep first */
	    node = node->children;
	} else if ((node != tree) && (node->next != NULL)) {
	    /* then siblings */
	    node = node->next;
	} else if (node != tree) {
	    /* go up to parents->next if needed */
	    while (node != tree) {
	        if (node->parent != NULL)
		    node = node->parent;
		if ((node != tree) && (node->next != NULL)) {
		    node = node->next;
		    break;
		}
		if (node->parent == NULL) {
		    node = NULL;
		    break;
		}
	    }
	    /* exit condition */
	    if (node == tree)
	        node = NULL;
	} else
	    break;
    }
    if (oldNs != NULL)
	xmlFree(oldNs);
    if (newNs != NULL)
	xmlFree(newNs);
    return(ret);
}